

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkAbs2(Wlc_Ntk_t *pNtk,Vec_Int_t *vBlacks,Vec_Int_t **pvFlops)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Wlc_Ntk_t *p_03;
  Wlc_Obj_t *pWVar5;
  int *piVar6;
  Wlc_Ntk_t *pWVar7;
  Wlc_Ntk_t *p;
  int nOrigObjNum;
  Vec_Int_t *vMapNode2Pi;
  int iFanin;
  int iObj;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pNew;
  Vec_Int_t *vNodes;
  Vec_Int_t *vFlops;
  Vec_Int_t **pvFlops_local;
  Vec_Int_t *vBlacks_local;
  Wlc_Ntk_t *pNtk_local;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntDup(vBlacks);
  iVar1 = Wlc_NtkObjNumMax(pNtk);
  p_02 = Vec_IntStart(iVar1);
  iVar1 = Wlc_NtkObjNumMax(pNtk);
  p_03 = Wlc_NtkDupDfsSimple(pNtk);
  for (iObj = 0; iVar2 = Wlc_NtkCiNum(pNtk), iObj < iVar2; iObj = iObj + 1) {
    pWVar5 = Wlc_NtkCi(pNtk,iObj);
    iVar2 = Wlc_ObjIsPi(pWVar5);
    if (iVar2 == 0) {
      iVar2 = Wlc_ObjId(pNtk,pWVar5);
      Vec_IntPush(p_00,iVar2);
    }
  }
  for (iObj = 0; iVar2 = Vec_IntSize(p_01), iObj < iVar2; iObj = iObj + 1) {
    iVar2 = Vec_IntEntry(p_01,iObj);
    pWVar5 = Wlc_NtkObj(pNtk,iVar2);
    iVar2 = Wlc_ObjId(pNtk,pWVar5);
    iVar2 = Wlc_ObjCopy(pNtk,iVar2);
    Vec_IntWriteEntry(p_01,iObj,iVar2);
  }
  for (iObj = 0; iVar2 = Vec_IntSize(p_01), iObj < iVar2; iObj = iObj + 1) {
    iVar2 = Vec_IntEntry(p_01,iObj);
    pWVar5 = Wlc_NtkObj(p_03,iVar2);
    iVar2 = Wlc_ObjId(p_03,pWVar5);
    *(ushort *)pWVar5 = *(ushort *)pWVar5 & 0xff7f | 0x80;
    iVar3 = Wlc_ObjIsSigned(pWVar5);
    iVar4 = Wlc_ObjRange(pWVar5);
    iVar3 = Wlc_ObjAlloc(p_03,1,iVar3,iVar4 + -1,0);
    Vec_IntWriteEntry(p_02,iVar2,iVar3);
  }
  Wlc_NtkCleanCopy(p_03);
  for (iObj = 1;
      (iVar2 = Wlc_NtkObjNumMax(p_03), iObj < iVar2 &&
      (pWVar5 = Wlc_NtkObj(p_03,iObj), iObj != iVar1)); iObj = iObj + 1) {
    if ((*(ushort *)pWVar5 >> 7 & 1) == 0) {
      for (iFanin = 0; iVar2 = Wlc_ObjFaninNum(pWVar5), iFanin < iVar2; iFanin = iFanin + 1) {
        iVar2 = Wlc_ObjFaninId(pWVar5,iFanin);
        iVar2 = Wlc_ObjCopy(p_03,iVar2);
        piVar6 = Wlc_ObjFanins(pWVar5);
        piVar6[iFanin] = iVar2;
      }
      vMapNode2Pi._4_4_ = iObj;
    }
    else {
      *(ushort *)pWVar5 = *(ushort *)pWVar5 & 0xff7f;
      vMapNode2Pi._4_4_ = Vec_IntEntry(p_02,iObj);
    }
    Wlc_ObjSetCopy(p_03,iObj,vMapNode2Pi._4_4_);
  }
  for (iObj = 0; iVar1 = Wlc_NtkCoNum(p_03), iObj < iVar1; iObj = iObj + 1) {
    pWVar5 = Wlc_NtkCo(p_03,iObj);
    iVar1 = Wlc_ObjId(p_03,pWVar5);
    iVar2 = Wlc_ObjCopy(p_03,iVar1);
    if (iVar1 != iVar2) {
      if ((*(ushort *)pWVar5 >> 10 & 1) == 0) {
        iVar2 = Wlc_ObjCopy(p_03,iVar1);
        pWVar5 = Wlc_NtkObj(p_03,iVar2);
        *(ushort *)pWVar5 = *(ushort *)pWVar5 & 0xfdff | 0x200;
      }
      else {
        iVar2 = Wlc_ObjCopy(p_03,iVar1);
        pWVar5 = Wlc_NtkObj(p_03,iVar2);
        *(ushort *)pWVar5 = *(ushort *)pWVar5 & 0xfbff | 0x400;
      }
      iVar1 = Wlc_ObjCopy(p_03,iVar1);
      Vec_IntWriteEntry(&p_03->vCos,iObj,iVar1);
    }
  }
  pWVar7 = Wlc_NtkDupDfsSimple(p_03);
  Vec_IntFree(p_02);
  Vec_IntFree(p_01);
  Wlc_NtkFree(p_03);
  if (pvFlops == (Vec_Int_t **)0x0) {
    Vec_IntFree(p_00);
  }
  else {
    *pvFlops = p_00;
  }
  return pWVar7;
}

Assistant:

static Wlc_Ntk_t * Wlc_NtkAbs2( Wlc_Ntk_t * pNtk, Vec_Int_t * vBlacks, Vec_Int_t ** pvFlops )
{
    Vec_Int_t * vFlops  = Vec_IntAlloc( 100 );
    Vec_Int_t * vNodes  = Vec_IntDup( vBlacks );
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    Vec_Int_t * vMapNode2Pi = Vec_IntStart( Wlc_NtkObjNumMax(pNtk) );
    int nOrigObjNum = Wlc_NtkObjNumMax( pNtk );
    Wlc_Ntk_t * p = Wlc_NtkDupDfsSimple( pNtk );

    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( !Wlc_ObjIsPi( pObj ) )
            Vec_IntPush( vFlops, Wlc_ObjId( pNtk, pObj ) ); 
    }

    Wlc_NtkForEachObjVec( vNodes, pNtk, pObj, i ) 
        Vec_IntWriteEntry(vNodes, i, Wlc_ObjCopy(pNtk, Wlc_ObjId(pNtk, pObj)));

    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i ) 
    {
        iObj = Wlc_ObjId(p, pObj);
        pObj->Mark = 1;
        // add fresh PI with the same number of bits
        Vec_IntWriteEntry( vMapNode2Pi, iObj, Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 ) );
    }

    Wlc_NtkCleanCopy( p );

    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == nOrigObjNum ) 
            break;

        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            iObj = Vec_IntEntry( vMapNode2Pi, i );
        }
        else {
            // update fanins
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }

    Wlc_NtkForEachCo( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        if (iObj != Wlc_ObjCopy(p, iObj)) 
        {
            if (pObj->fIsFi)
                Wlc_NtkObj(p, Wlc_ObjCopy(p, iObj))->fIsFi = 1;
            else
                Wlc_NtkObj(p, Wlc_ObjCopy(p, iObj))->fIsPo = 1;


            Vec_IntWriteEntry(&p->vCos, i, Wlc_ObjCopy(p, iObj));
        }
    }

    pNew = Wlc_NtkDupDfsSimple( p );
    Vec_IntFree( vMapNode2Pi );
    Vec_IntFree( vNodes );
    Wlc_NtkFree( p );

    if ( pvFlops )
        *pvFlops = vFlops;
    else
        Vec_IntFree( vFlops );

    return pNew;
}